

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.cpp
# Opt level: O3

QSize __thiscall QSize::scaled(QSize *this,QSize *s,AspectRatioMode mode)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  QSize QVar5;
  long lVar6;
  long lVar7;
  
  if (((mode == IgnoreAspectRatio) || (lVar7 = (long)(this->wd).m_i, lVar7 == 0)) ||
     (lVar6 = (long)(this->ht).m_i, lVar6 == 0)) {
    QVar5 = *s;
    uVar3 = (ulong)QVar5 >> 0x20;
    goto LAB_00389928;
  }
  uVar3 = (ulong)(s->ht).m_i;
  uVar2 = (long)(uVar3 * lVar7) / lVar6;
  uVar1 = (s->wd).m_i;
  QVar5.ht.m_i = 0;
  QVar5.wd.m_i = uVar1;
  lVar4 = (long)(int)uVar1;
  if (mode == KeepAspectRatio) {
    if (lVar4 < (long)uVar2) {
LAB_00389937:
      uVar3 = (lVar4 * lVar6) / lVar7;
      goto LAB_00389928;
    }
  }
  else if ((long)uVar2 < lVar4) goto LAB_00389937;
  QVar5 = (QSize)(uVar2 & 0xffffffff);
LAB_00389928:
  return (QSize)((ulong)QVar5 & 0xffffffff | uVar3 << 0x20);
}

Assistant:

QSize QSize::scaled(const QSize &s, Qt::AspectRatioMode mode) const noexcept
{
    if (mode == Qt::IgnoreAspectRatio || wd == 0 || ht == 0) {
        return s;
    } else {
        bool useHeight;
        qint64 rw = qint64(s.height()) * qint64(width()) / qint64(height());

        if (mode == Qt::KeepAspectRatio) {
            useHeight = (rw <= s.width());
        } else { // mode == Qt::KeepAspectRatioByExpanding
            useHeight = (rw >= s.width());
        }

        if (useHeight) {
            return QSize(int(rw), s.height());
        } else {
            return QSize(s.width(),
                         qint32(qint64(s.width()) * qint64(height()) / qint64(width())));
        }
    }
}